

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CheckerDataDeclarationSyntax::setChild
          (CheckerDataDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined4 uVar1;
  SyntaxNode *pSVar2;
  DataDeclarationSyntax *pDVar3;
  SyntaxNode *pSVar4;
  Token TVar5;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pDVar3 = (DataDeclarationSyntax *)0x0;
    }
    else {
      pDVar3 = (DataDeclarationSyntax *)TokenOrSyntax::node(&child);
    }
    (this->data).ptr = pDVar3;
  }
  else if (index == 1) {
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->rand).kind = TVar5.kind;
    (this->rand).field_0x2 = TVar5._2_1_;
    (this->rand).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
    (this->rand).rawLen = TVar5.rawLen;
    (this->rand).info = TVar5.info;
  }
  else {
    pSVar4 = TokenOrSyntax::node(&child);
    uVar1 = *(undefined4 *)&pSVar4->field_0x4;
    pSVar2 = pSVar4->parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = pSVar4->kind;
    *(undefined4 *)
     &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar1;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar4->previewNode;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount = *(size_t *)(pSVar4 + 1);
    pSVar2 = pSVar4[1].previewNode;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar4[1].parent;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  return;
}

Assistant:

void CheckerDataDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: rand = child.token(); return;
        case 2: data = child.node() ? &child.node()->as<DataDeclarationSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}